

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  pointer pcVar1;
  cmMakefile *this_00;
  string *psVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view str;
  string_view source;
  string_view separator;
  string remove;
  string fc;
  string cleanfile;
  string currentBinDir;
  ofstream fout;
  string local_320;
  char *local_300;
  string local_2f8;
  undefined1 local_2d8 [8];
  cmOutputConverter *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Base_ptr local_2b8;
  string *local_2b0;
  string local_2a0;
  long *local_280;
  _func_int **local_278;
  long local_270 [2];
  cmGeneratorTarget *local_260;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_258;
  string local_250;
  undefined1 local_230 [8];
  long *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  undefined8 local_218;
  char *local_210;
  undefined8 local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  undefined8 local_1d8;
  ios_base local_138 [264];
  
  local_300 = filename;
  local_258 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_280 = local_270;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + psVar2->_M_string_length);
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[0x10])(&local_320,this,target);
  local_230 = (undefined1  [8])local_278;
  local_228 = local_280;
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2c8._M_allocated_capacity = (size_type)(local_2c8._M_local_buf + 8);
  local_2d8 = (undefined1  [8])0x0;
  local_2d0 = (cmOutputConverter *)0x1;
  local_2c8._M_local_buf[8] = 0x2f;
  local_218 = 1;
  local_208 = 0;
  local_200 = local_320._M_string_length;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p;
  local_1e8 = 0xc;
  local_1e0 = "/cmake_clean";
  local_1d8 = 0;
  views._M_len = 4;
  views._M_array = (iterator)local_230;
  local_210 = (char *)local_2c8._M_allocated_capacity;
  local_1f0 = &local_320;
  cmCatViews(&local_2a0,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_2a0);
    std::__cxx11::string::append((char *)&local_2a0);
  }
  std::__cxx11::string::append((char *)&local_2a0);
  std::ofstream::ofstream(local_230,local_2a0._M_dataplus._M_p,_S_out);
  if ((*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "Could not create ",&local_2a0);
    cmSystemTools::Error((string *)local_2d8);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
  }
  if ((files->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"file(REMOVE_RECURSE\n",0x14);
    p_Var4 = (files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(files->_M_t)._M_impl.super__Rb_tree_header;
    local_260 = target;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_2d8,(cmOutputConverter *)this,(string *)(p_Var4 + 1));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  ",2);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)local_2d8;
        cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_320,local_2d0,str,(WrapQuotes)filename);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,")\n",2);
    target = local_260;
  }
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_250,(cmOutputConverter *)this,&local_2a0);
  source._M_str = local_250._M_dataplus._M_p;
  source._M_len = local_250._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_2f8,(cmOutputConverter *)this,source,SHELL,false);
  local_2d8 = (undefined1  [8])&DAT_00000014;
  local_2d0 = (cmOutputConverter *)0x96547d;
  local_2c8._M_allocated_capacity = 0;
  local_2c8._8_8_ = local_2f8._M_string_length;
  local_2b8 = (_Base_ptr)local_2f8._M_dataplus._M_p;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_2d8;
  local_2b0 = &local_2f8;
  cmCatViews(&local_320,views_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_258,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_300 == (char *)0x0) {
    local_2c8._8_8_ = &local_2d0;
    local_2d0 = (cmOutputConverter *)((ulong)local_2d0 & 0xffffffff00000000);
    local_2c8._M_allocated_capacity = 0;
    local_2b0 = (string *)0x0;
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_2b8 = (_Base_ptr)local_2c8._8_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CMAKE_BUILD_TYPE","");
    psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_320);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2d8,psVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"# Per-language clean rules from dependency scanning.\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"foreach(lang ",0xd);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_320,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d8,separator);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  include(",10);
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0x10])(&local_2f8,this,target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"/cmake_clean_${lang}.cmake OPTIONAL)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"endforeach()\n",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = cmStrCat(
    currentBinDir, '/', this->GetTargetDirectory(target), "/cmake_clean");
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  cmsys::ofstream fout(cleanfile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfile);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeRelativeToCurBinDir(file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(this->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}